

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O2

ALCenum __thiscall
anon_unknown.dwarf_239414::AlsaCapture::captureSamples
          (AlsaCapture *this,byte *buffer,ALCuint samples)

{
  RingBuffer *this_00;
  pointer pbVar1;
  pointer pbVar2;
  const_iterator __first;
  FILE *__stream;
  int iVar3;
  ulong uVar4;
  size_t __n;
  undefined8 uVar5;
  size_t in_RCX;
  long __n2;
  ulong uVar6;
  
  this_00 = (this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>.
            _M_t.super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
            super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
  if (this_00 != (RingBuffer *)0x0) {
    RingBuffer::read(this_00,(int)buffer,(void *)(ulong)samples,in_RCX);
    return 0;
  }
  this->mLastAvail = this->mLastAvail - (long)(ulong)samples;
  do {
    uVar6 = (ulong)samples;
LAB_0015c135:
    if ((((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) ||
       (samples == 0)) {
      if (uVar6 == 0) {
        return 0;
      }
      goto LAB_0015c295;
    }
    pbVar1 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar2 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pbVar1 != pbVar2) {
      uVar4 = (*(anonymous_namespace)::psnd_pcm_bytes_to_frames)
                        (this->mPcmHandle,(long)pbVar2 - (long)pbVar1);
      if (uVar6 <= uVar4) {
        uVar4 = uVar6;
      }
      __n = (*(anonymous_namespace)::psnd_pcm_frames_to_bytes)(this->mPcmHandle,uVar4);
      if (0 < (long)__n) {
        memmove(buffer,(this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                       _M_impl.super__Vector_impl_data._M_start,__n);
      }
      __first._M_current =
           (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::erase
                (&this->mBuffer,__first,(const_iterator)(__first._M_current + __n));
      uVar4 = (*(anonymous_namespace)::psnd_pcm_bytes_to_frames)(this->mPcmHandle,__n);
LAB_0015c1ce:
      __stream = gLogFile;
      if (-1 < (long)uVar4) goto LAB_0015c25d;
      if (0 < (int)gLogLevel) {
        uVar5 = (*(anonymous_namespace)::psnd_strerror)(uVar4 & 0xffffffff);
        fprintf((FILE *)__stream,"[ALSOFT] (EE) read error: %s\n",uVar5);
      }
      if (uVar4 != 0xfffffffffffffff5) {
        iVar3 = (*(anonymous_namespace)::psnd_pcm_recover)(this->mPcmHandle,uVar4 & 0xffffffff,1);
        if ((iVar3 < 0) ||
           (iVar3 = (*(anonymous_namespace)::psnd_pcm_start)(this->mPcmHandle), iVar3 < 0)) {
          uVar4 = (ulong)iVar3;
        }
        else {
          uVar4 = (*(anonymous_namespace)::psnd_pcm_avail_update)(this->mPcmHandle);
        }
        if ((long)uVar4 < 0) {
          uVar5 = (*(anonymous_namespace)::psnd_strerror)(uVar4 & 0xffffffff);
          if (0 < (int)gLogLevel) {
            fprintf((FILE *)gLogFile,"[ALSOFT] (EE) restore error: %s\n",uVar5);
          }
          ALCdevice::handleDisconnect
                    ((this->super_BackendBase).mDevice,"Capture recovery failure: %s",uVar5);
        }
        else if (uVar6 <= uVar4) goto LAB_0015c135;
LAB_0015c295:
        uVar5 = (*(anonymous_namespace)::psnd_pcm_frames_to_bytes)(this->mPcmHandle,uVar6);
        std::__fill_n_a<al::byte*,long,al::byte>(buffer,uVar5);
        return 0;
      }
      goto LAB_0015c135;
    }
    if (this->mDoCapture == true) {
      uVar4 = (*(anonymous_namespace)::psnd_pcm_readi)(this->mPcmHandle,buffer,uVar6);
      goto LAB_0015c1ce;
    }
    uVar4 = 0;
LAB_0015c25d:
    buffer = buffer + uVar4;
    samples = samples - (int)uVar4;
  } while( true );
}

Assistant:

ALCenum AlsaCapture::captureSamples(al::byte *buffer, ALCuint samples)
{
    if(mRing)
    {
        mRing->read(buffer, samples);
        return ALC_NO_ERROR;
    }

    mLastAvail -= samples;
    while(mDevice->Connected.load(std::memory_order_acquire) && samples > 0)
    {
        snd_pcm_sframes_t amt{0};

        if(!mBuffer.empty())
        {
            /* First get any data stored from the last stop */
            amt = snd_pcm_bytes_to_frames(mPcmHandle, static_cast<ssize_t>(mBuffer.size()));
            if(static_cast<snd_pcm_uframes_t>(amt) > samples) amt = samples;

            amt = snd_pcm_frames_to_bytes(mPcmHandle, amt);
            std::copy_n(mBuffer.begin(), amt, buffer);

            mBuffer.erase(mBuffer.begin(), mBuffer.begin()+amt);
            amt = snd_pcm_bytes_to_frames(mPcmHandle, amt);
        }
        else if(mDoCapture)
            amt = snd_pcm_readi(mPcmHandle, buffer, samples);
        if(amt < 0)
        {
            ERR("read error: %s\n", snd_strerror(static_cast<int>(amt)));

            if(amt == -EAGAIN)
                continue;
            if((amt=snd_pcm_recover(mPcmHandle, static_cast<int>(amt), 1)) >= 0)
            {
                amt = snd_pcm_start(mPcmHandle);
                if(amt >= 0)
                    amt = snd_pcm_avail_update(mPcmHandle);
            }
            if(amt < 0)
            {
                const char *err{snd_strerror(static_cast<int>(amt))};
                ERR("restore error: %s\n", err);
                mDevice->handleDisconnect("Capture recovery failure: %s", err);
                break;
            }
            /* If the amount available is less than what's asked, we lost it
             * during recovery. So just give silence instead. */
            if(static_cast<snd_pcm_uframes_t>(amt) < samples)
                break;
            continue;
        }

        buffer = buffer + amt;
        samples -= static_cast<ALCuint>(amt);
    }
    if(samples > 0)
        std::fill_n(buffer, snd_pcm_frames_to_bytes(mPcmHandle, samples),
            al::byte((mDevice->FmtType == DevFmtUByte) ? 0x80 : 0));

    return ALC_NO_ERROR;
}